

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::train_single_example<true>
               (search *sch,bool is_test_ex,bool is_holdout_ex,multi_ex *ec_seq)

{
  polylabel *losses;
  search_private *priv;
  shared_data *psVar1;
  stringstream *psVar2;
  pointer puVar3;
  int *piVar4;
  _func_void_int_string_v_array<char> *p_Var5;
  pointer pcVar6;
  v_array<char> vVar7;
  v_array<char> vVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  undefined **ppuVar13;
  size_t sVar14;
  uint *puVar15;
  ulong uVar16;
  int *piVar17;
  example *peVar18;
  ulong uVar19;
  vw *all;
  undefined1 in_stack_fffffffffffffef8 [15];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [16];
  search *local_b8;
  undefined1 *local_b0;
  undefined1 local_a0 [16];
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  priv = sch->priv;
  all = priv->all;
  clear_cache_hash_map(priv);
  cVar9 = must_run_test(all,ec_seq,is_test_ex);
  if ((bool)cVar9) {
    reset_search_structure(priv);
    priv->state = INIT_TEST;
    psVar1 = all->sd;
    if ((((psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples + 1.0 <
           (double)psVar1->dump_interval) || (all->quiet != false)) ||
        (bVar10 = true, all->bfgs == true)) &&
       (bVar10 = true, (all->final_prediction_sink)._end == (all->final_prediction_sink)._begin)) {
      bVar10 = 0 < all->raw_prediction;
    }
    priv->should_produce_string = bVar10;
    psVar2 = priv->pred_string;
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    std::__cxx11::stringbuf::str((string *)(psVar2 + 0x18));
    if (local_d8 != local_c8) {
      operator_delete(local_d8);
    }
    puVar3 = (priv->test_action_sequence).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((priv->test_action_sequence).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (priv->test_action_sequence).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
    local_b8 = sch;
    run_task(sch,ec_seq);
    if (!is_test_ex) {
      shared_data::update(all->sd,(*(ec_seq->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->test_only,true,
                          priv->test_loss,1.0,priv->num_features);
    }
    piVar4 = (all->final_prediction_sink)._end;
    sch = local_b8;
    for (piVar17 = (all->final_prediction_sink)._begin; local_b8 = sch, piVar17 != piVar4;
        piVar17 = piVar17 + 1) {
      iVar11 = *piVar17;
      p_Var5 = all->print_text;
      std::__cxx11::stringbuf::str();
      vVar7._end._7_1_ = cVar9;
      vVar7._0_15_ = in_stack_fffffffffffffef8;
      vVar7.end_array = (char *)ec_seq;
      vVar7.erase_count = (size_t)all;
      (*p_Var5)(iVar11,(string)(*(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)
                                 ._M_impl.super__Vector_impl_data._M_start)->tag,vVar7);
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      sch = local_b8;
    }
    iVar11 = all->raw_prediction;
    if (0 < iVar11) {
      p_Var5 = all->print_text;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
      vVar8._end._7_1_ = cVar9;
      vVar8._0_15_ = in_stack_fffffffffffffef8;
      vVar8.end_array = (char *)ec_seq;
      vVar8.erase_count = (size_t)all;
      (*p_Var5)(iVar11,(string)(*(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)
                                 ._M_impl.super__Vector_impl_data._M_start)->tag,vVar8);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
  }
  if (((!is_holdout_ex && !is_test_ex) &&
      ((*(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->test_only == false)) && (priv->all->training == true)) {
    clear_cache_hash_map(priv);
    reset_search_structure(priv);
    clear_memo_foreach_action(priv);
    priv->state = INIT_TRAIN;
    v_array<std::pair<float,_unsigned_long>_>::clear(&priv->active_uncertainty);
    v_array<Search::scored_action>::clear(&priv->train_trajectory);
    run_task(sch,ec_seq);
    if (cVar9 == '\0') {
      shared_data::update(all->sd,(*(ec_seq->
                                    super__Vector_base<example_*,_std::allocator<example_*>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->test_only,true,
                          priv->test_loss,1.0,priv->num_features);
    }
    if (priv->loss_declared_cnt != 0) {
      if ((priv->t + priv->meta_t != 0) && (priv->rollout_method != NO_ROLLOUT)) {
        sVar14 = priv->meta_t;
        if (priv->metatask == (search_metatask *)0x0) {
          sVar14 = priv->t;
        }
        priv->T = sVar14;
        get_training_timesteps(priv,&priv->timesteps);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        losses = &priv->learn_losses;
        if (priv->cb_learner == true) {
          v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&losses->simple);
        }
        else {
          v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&losses->simple)
          ;
        }
        if ((priv->timesteps)._end != (priv->timesteps)._begin) {
          uVar19 = 0;
          do {
            if ((priv->metatask == (search_metatask *)0x0) ||
               ((priv->memo_foreach_action)._begin[uVar19] != (v_array<Search::action_cache> *)0x0))
            {
              priv->learn_ec_ref = (example *)0x0;
              priv->learn_ec_ref_cnt = 0;
              reset_search_structure(priv);
              priv->learn_a_idx = 0;
              priv->done_with_all_actions = false;
              priv->learn_t = (priv->timesteps)._begin[uVar19];
              advance_from_known_actions(priv);
              bVar10 = priv->done_with_all_actions;
              cVar9 = bVar10;
              while (cVar9 == '\0') {
                reset_search_structure(priv);
                priv->state = LEARN;
                priv->learn_t = (priv->timesteps)._begin[uVar19];
                run_task(sch,ec_seq);
                iVar11 = (int)priv->learn_a_idx - (uint)priv->is_ldf;
                if (priv->cb_learner == true) {
                  local_d8 = (undefined1 *)CONCAT44(iVar11,priv->learn_loss);
                  local_d0._0_4_ = 0.0;
                  local_d0._4_4_ = 0.0;
                  v_array<CB::cb_class>::push_back
                            ((v_array<CB::cb_class> *)&losses->simple,(cb_class *)&local_d8);
                }
                else {
                  local_d8 = (undefined1 *)CONCAT44(iVar11,priv->learn_loss);
                  local_d0._0_4_ = 0.0;
                  local_d0._4_4_ = 0.0;
                  v_array<COST_SENSITIVE::wclass>::push_back
                            ((v_array<COST_SENSITIVE::wclass> *)&losses->simple,(wclass *)&local_d8)
                  ;
                }
                if (priv->done_with_all_actions == true) break;
                priv->learn_t = (priv->timesteps)._begin[uVar19];
                advance_from_known_actions(priv);
                cVar9 = priv->done_with_all_actions;
              }
              if (0.0 < priv->active_csoaa_verify) {
                verify_active_csoaa(&losses->cs,(priv->active_known)._begin + priv->learn_t,
                                    (*(ec_seq->
                                      super__Vector_base<example_*,_std::allocator<example_*>_>).
                                      _M_impl.super__Vector_impl_data._M_start)->example_counter,
                                    priv->active_csoaa_verify);
              }
              if (bVar10 != false) {
                reset_search_structure(priv);
                priv->state = LEARN;
                priv->learn_t = (priv->timesteps)._begin[uVar19];
                priv->force_setup_ec_ref = true;
                run_task(sch,ec_seq);
              }
              if (((priv->learn_allowed_actions)._end != (priv->learn_allowed_actions)._begin) &&
                 (puVar15 = (priv->learn_allowed_actions)._begin,
                 (priv->learn_allowed_actions)._end != puVar15)) {
                lVar12 = 4;
                uVar16 = 0;
                do {
                  *(uint *)((long)&((priv->learn_losses).cs.costs._begin)->x + lVar12) =
                       puVar15[uVar16];
                  uVar16 = uVar16 + 1;
                  puVar15 = (priv->learn_allowed_actions)._begin;
                  lVar12 = lVar12 + 0x10;
                } while (uVar16 < (ulong)((long)(priv->learn_allowed_actions)._end - (long)puVar15
                                         >> 2));
              }
              generate_training_example(priv,losses,1.0,true,3.4028235e+38);
              if ((priv->examples_dont_change == false) &&
                 (peVar18 = (priv->learn_ec_copy)._begin, (priv->learn_ec_copy)._end != peVar18)) {
                lVar12 = 0x6828;
                uVar16 = 0;
                do {
                  ppuVar13 = &MULTICLASS::mc_label;
                  if (sch->priv->is_ldf != false) {
                    ppuVar13 = &COST_SENSITIVE::cs_label;
                  }
                  (*(code *)ppuVar13[4])
                            ((long)(peVar18->super_example_predict).feature_space + lVar12 + -0x20);
                  uVar16 = uVar16 + 1;
                  peVar18 = (priv->learn_ec_copy)._begin;
                  lVar12 = lVar12 + 0x68d0;
                } while (uVar16 < (ulong)(((long)(priv->learn_ec_copy)._end - (long)peVar18 >> 4) *
                                         -0x44d8c49e2629d3bb));
              }
              if (priv->cb_learner == true) {
                v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&losses->simple);
              }
              else {
                v_array<COST_SENSITIVE::wclass>::clear
                          ((v_array<COST_SENSITIVE::wclass> *)&losses->simple);
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < (ulong)((long)(priv->timesteps)._end - (long)(priv->timesteps)._begin >>
                                   3));
        }
        if ((priv->active_csoaa != false) && (uVar19 = priv->save_every_k_runs, 1 < uVar19)) {
          uVar16 = priv->num_calls_to_run / uVar19;
          if (priv->num_calls_to_run_previous / uVar19 < uVar16) {
            pcVar6 = (all->final_regressor_name)._M_dataplus._M_p;
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar6,
                       pcVar6 + (all->final_regressor_name)._M_string_length);
            save_predictor(all,&local_90,uVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
          }
          priv->num_calls_to_run_previous = priv->num_calls_to_run;
        }
      }
    }
  }
  return;
}

Assistant:

void train_single_example(search& sch, bool is_test_ex, bool is_holdout_ex, multi_ex& ec_seq)
{
  search_private& priv = *sch.priv;
  vw& all = *priv.all;
  bool ran_test = false;  // we must keep track so that even if we skip test, we still update # of examples seen

  // if (! priv.no_caching)
  clear_cache_hash_map(priv);

  cdbg << "is_test_ex=" << is_test_ex << " vw_is_main=" << all.vw_is_main << endl;
  cdbg << "must_run_test = " << must_run_test(all, ec_seq, is_test_ex) << endl;
  // do an initial test pass to compute output (and loss)
  if (must_run_test(all, ec_seq, is_test_ex))
  {
    cdbg << "======================================== INIT TEST (" << priv.current_policy << ","
         << priv.read_example_last_pass << ") ========================================" << endl;

    ran_test = true;

    // do the prediction
    reset_search_structure(priv);
    priv.state = INIT_TEST;
    priv.should_produce_string =
        might_print_update(all) || (all.final_prediction_sink.size() > 0) || (all.raw_prediction > 0);
    priv.pred_string->str("");
    priv.test_action_sequence.clear();
    run_task(sch, ec_seq);

    // accumulate loss
    if (!is_test_ex)
      all.sd->update(ec_seq[0]->test_only, !is_test_ex, priv.test_loss, 1.f, priv.num_features);

    // generate output
    for (int sink : all.final_prediction_sink) all.print_text((int)sink, priv.pred_string->str(), ec_seq[0]->tag);

    if (all.raw_prediction > 0)
      all.print_text(all.raw_prediction, "", ec_seq[0]->tag);
  }

  // if we're not training, then we're done!
  if ((!is_learn) || is_test_ex || is_holdout_ex || ec_seq[0]->test_only || (!priv.all->training))
    return;

  // SPEEDUP: if the oracle was never called, we can skip this!

  // do a pass over the data allowing oracle
  cdbg << "======================================== INIT TRAIN (" << priv.current_policy << ","
       << priv.read_example_last_pass << ") ========================================" << endl;
  // cerr << "training" << endl;

  clear_cache_hash_map(priv);
  reset_search_structure(priv);
  clear_memo_foreach_action(priv);
  priv.state = INIT_TRAIN;
  priv.active_uncertainty.clear();
  priv.train_trajectory.clear();  // this is where we'll store the training sequence
  run_task(sch, ec_seq);

  if (!ran_test)  // was  && !priv.ec_seq[0]->test_only) { but we know it's not test_only
    all.sd->update(ec_seq[0]->test_only, true, priv.test_loss, 1.f, priv.num_features);

  // if there's nothing to train on, we're done!
  if ((priv.loss_declared_cnt == 0) || (priv.t + priv.meta_t == 0) ||
      (priv.rollout_method == NO_ROLLOUT))  // TODO: make sure NO_ROLLOUT works with beam!
  {
    return;
  }

  // otherwise, we have some learn'in to do!
  cdbg << "======================================== LEARN (" << priv.current_policy << ","
       << priv.read_example_last_pass << ") ========================================" << endl;
  priv.T = priv.metatask ? priv.meta_t : priv.t;
  get_training_timesteps(priv, priv.timesteps);
  cdbg << "train_trajectory.size() = " << priv.train_trajectory.size() << ":\t";
  cdbg_print_array<scored_action>("", priv.train_trajectory);
  // cdbg << "memo_foreach_action = " << priv.memo_foreach_action << endl;
  for (size_t i = 0; i < priv.memo_foreach_action.size(); i++)
  {
    cdbg << "memo_foreach_action[" << i << "] = ";
    if (priv.memo_foreach_action[i])
      cdbg << *priv.memo_foreach_action[i];
    else
      cdbg << "null";
    cdbg << endl;
  }

  if (priv.cb_learner)
    priv.learn_losses.cb.costs.clear();
  else
    priv.learn_losses.cs.costs.clear();

  for (size_t tid = 0; tid < priv.timesteps.size(); tid++)
  {
    cdbg << "timestep = " << priv.timesteps[tid] << " [" << tid << "/" << priv.timesteps.size() << "]" << endl;

    if (priv.metatask && !priv.memo_foreach_action[tid])
    {
      cdbg << "skipping because it looks like this was overridden by metatask" << endl;
      continue;
    }

    priv.learn_ec_ref = nullptr;
    priv.learn_ec_ref_cnt = 0;

    reset_search_structure(priv);  // TODO remove this?
    bool skipped_all_actions = true;
    priv.learn_a_idx = 0;
    priv.done_with_all_actions = false;
    // for each action, roll out to get a loss
    while (!priv.done_with_all_actions)
    {
      priv.learn_t = priv.timesteps[tid];
      advance_from_known_actions(priv);
      if (priv.done_with_all_actions)
        break;

      skipped_all_actions = false;
      reset_search_structure(priv);

      priv.state = LEARN;
      priv.learn_t = priv.timesteps[tid];
      cdbg << "-------------------------------------------------------------------------------------" << endl;
      cdbg << "learn_t = " << priv.learn_t << ", learn_a_idx = " << priv.learn_a_idx << endl;
      // cdbg_print_array("priv.active_known[learn_t]", priv.active_known[priv.learn_t]);
      run_task(sch, ec_seq);
      // cerr_print_array("in GENER, learn_allowed_actions", priv.learn_allowed_actions);
      float this_loss = priv.learn_loss;
      cs_cost_push_back(priv.cb_learner, priv.learn_losses,
          priv.is_ldf ? (uint32_t)(priv.learn_a_idx - 1) : (uint32_t)priv.learn_a_idx, this_loss);
      //                          (priv.learn_allowed_actions.size() > 0) ?
      //                          priv.learn_allowed_actions[priv.learn_a_idx-1] : priv.is_ldf ? (priv.learn_a_idx-1) :
      //                          (priv.learn_a_idx),
      //                           priv.learn_loss);
    }
    if (priv.active_csoaa_verify > 0.)
      verify_active_csoaa(
          priv.learn_losses.cs, priv.active_known[priv.learn_t], ec_seq[0]->example_counter, priv.active_csoaa_verify);

    if (skipped_all_actions)
    {
      reset_search_structure(priv);
      priv.state = LEARN;
      priv.learn_t = priv.timesteps[tid];
      priv.force_setup_ec_ref = true;
      cdbg << "<<<<<" << endl;
      cdbg << "skipped all actions; learn_t = " << priv.learn_t << ", learn_a_idx = " << priv.learn_a_idx << endl;
      run_task(sch, ec_seq);  // TODO: i guess we can break out of this early
      cdbg << ">>>>>" << endl;
    }
    else
      cdbg << "didn't skip all actions" << endl;

    // now we can make a training example
    if (priv.learn_allowed_actions.size() > 0)
    {
      for (size_t i = 0; i < priv.learn_allowed_actions.size(); i++)
      {
        priv.learn_losses.cs.costs[i].class_index = priv.learn_allowed_actions[i];
      }
    }
    // float min_loss = 0.;
    // if (priv.metatask)
    //  for (size_t aid=0; aid<priv.memo_foreach_action[tid]->size(); aid++)
    //    min_loss = MIN(min_loss, priv.memo_foreach_action[tid]->get(aid).cost);
    cdbg << "priv.learn_losses = [";
    for (auto& wc : priv.learn_losses.cs.costs) cdbg << " " << wc.class_index << ":" << wc.x;
    cdbg << " ]" << endl;
    cdbg << "gte" << endl;
    generate_training_example(priv, priv.learn_losses, 1., true);  // , min_loss);  // TODO: weight
    if (!priv.examples_dont_change)
      for (size_t n = 0; n < priv.learn_ec_copy.size(); n++)
      {
        if (sch.priv->is_ldf)
          CS::cs_label.delete_label(&priv.learn_ec_copy[n].l.cs);
        else
          MC::mc_label.delete_label(&priv.learn_ec_copy[n].l.multi);
      }
    if (priv.cb_learner)
      priv.learn_losses.cb.costs.clear();
    else
      priv.learn_losses.cs.costs.clear();
  }

  if (priv.active_csoaa && (priv.save_every_k_runs > 1))
  {
    size_t prev_num = priv.num_calls_to_run_previous / priv.save_every_k_runs;
    size_t this_num = priv.num_calls_to_run / priv.save_every_k_runs;
    if (this_num > prev_num)
      save_predictor(all, all.final_regressor_name, this_num);
    priv.num_calls_to_run_previous = priv.num_calls_to_run;
  }
}